

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqbinaryast.cpp
# Opt level: O0

Node * __thiscall SQASTReader::readNode(SQASTReader *this,TreeOp op)

{
  SQASTReader *this_00;
  TreeOp in_ESI;
  SQASTReader *in_RDI;
  SQASTReader *unaff_retaddr;
  bool in_stack_0000000f;
  undefined4 in_stack_00000010;
  bool in_stack_0000003f;
  SQASTReader *in_stack_00000040;
  undefined4 in_stack_ffffffffffffffe8;
  FunctionDecl *local_8;
  
  this_00 = (SQASTReader *)(ulong)in_ESI;
  switch(this_00) {
  case (SQASTReader *)0x0:
    local_8 = (FunctionDecl *)
              readBlock((SQASTReader *)CONCAT44(op,in_stack_00000010),in_stack_0000000f);
    break;
  case (SQASTReader *)0x1:
    local_8 = (FunctionDecl *)readIfStatement(in_RDI);
    break;
  case (SQASTReader *)0x2:
    local_8 = (FunctionDecl *)readWhileStatement(in_RDI);
    break;
  case (SQASTReader *)0x3:
    local_8 = (FunctionDecl *)readDoWhileStatement(in_RDI);
    break;
  case (SQASTReader *)0x4:
    local_8 = (FunctionDecl *)readForStatement(unaff_retaddr);
    break;
  case (SQASTReader *)0x5:
    local_8 = (FunctionDecl *)readForeachStatement(unaff_retaddr);
    break;
  case (SQASTReader *)0x6:
    local_8 = (FunctionDecl *)readSwitchStatement((SQASTReader *)CONCAT44(op,in_stack_00000010));
    break;
  case (SQASTReader *)0x7:
    local_8 = (FunctionDecl *)readReturnStatement(in_RDI);
    break;
  case (SQASTReader *)0x8:
    local_8 = (FunctionDecl *)readYieldStatement(this_00);
    break;
  case (SQASTReader *)0x9:
    local_8 = (FunctionDecl *)readThrowStatement(this_00);
    break;
  case (SQASTReader *)0xa:
    local_8 = (FunctionDecl *)readTryStatement(in_RDI);
    break;
  case (SQASTReader *)0xb:
    local_8 = (FunctionDecl *)readBreakStatement((SQASTReader *)0x14242a);
    break;
  case (SQASTReader *)0xc:
    local_8 = (FunctionDecl *)readContinueStatement((SQASTReader *)0x14243d);
    break;
  case (SQASTReader *)0xd:
    local_8 = (FunctionDecl *)readExprStatement(this_00);
    break;
  case (SQASTReader *)0xe:
    local_8 = (FunctionDecl *)readEmptyStatement((SQASTReader *)0x142463);
    break;
  case (SQASTReader *)0xf:
    local_8 = (FunctionDecl *)readDirectiveStmt(this_00);
    break;
  default:
    local_8 = (FunctionDecl *)0x0;
    break;
  case (SQASTReader *)0x11:
    local_8 = (FunctionDecl *)readId(this_00);
    break;
  case (SQASTReader *)0x12:
    local_8 = (FunctionDecl *)readCommaExpr(unaff_retaddr);
    break;
  case (SQASTReader *)0x13:
  case (SQASTReader *)0x14:
  case (SQASTReader *)0x15:
  case (SQASTReader *)0x16:
  case (SQASTReader *)0x17:
  case (SQASTReader *)0x18:
  case (SQASTReader *)0x19:
  case (SQASTReader *)0x1a:
  case (SQASTReader *)0x1b:
  case (SQASTReader *)0x1c:
  case (SQASTReader *)0x1d:
  case (SQASTReader *)0x1e:
  case (SQASTReader *)0x1f:
  case (SQASTReader *)0x20:
  case (SQASTReader *)0x21:
  case (SQASTReader *)0x22:
  case (SQASTReader *)0x23:
  case (SQASTReader *)0x24:
  case (SQASTReader *)0x25:
  case (SQASTReader *)0x26:
  case (SQASTReader *)0x27:
  case (SQASTReader *)0x28:
  case (SQASTReader *)0x29:
  case (SQASTReader *)0x2a:
  case (SQASTReader *)0x2b:
  case (SQASTReader *)0x2c:
  case (SQASTReader *)0x2d:
  case (SQASTReader *)0x2e:
  case (SQASTReader *)0x2f:
  case (SQASTReader *)0x30:
    local_8 = (FunctionDecl *)readBinExpr(in_RDI,in_ESI);
    break;
  case (SQASTReader *)0x31:
  case (SQASTReader *)0x32:
  case (SQASTReader *)0x33:
  case (SQASTReader *)0x34:
  case (SQASTReader *)0x35:
  case (SQASTReader *)0x36:
  case (SQASTReader *)0x37:
  case (SQASTReader *)0x38:
    local_8 = (FunctionDecl *)readUnaryExpr(in_RDI,in_ESI);
    break;
  case (SQASTReader *)0x39:
    local_8 = (FunctionDecl *)readLiteral((SQASTReader *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8))
    ;
    break;
  case (SQASTReader *)0x3a:
    local_8 = (FunctionDecl *)readBaseExpr((SQASTReader *)0x1424dd);
    break;
  case (SQASTReader *)0x3b:
    local_8 = (FunctionDecl *)readRootTableAccessExpr((SQASTReader *)0x1424f0);
    break;
  case (SQASTReader *)0x3c:
    local_8 = (FunctionDecl *)readIncExpr(in_RDI);
    break;
  case (SQASTReader *)0x3d:
    local_8 = (FunctionDecl *)readDeclExpr(this_00);
    break;
  case (SQASTReader *)0x3e:
    local_8 = (FunctionDecl *)readArrayExpr(unaff_retaddr);
    break;
  case (SQASTReader *)0x3f:
    local_8 = (FunctionDecl *)readGetFieldExpr(in_RDI);
    break;
  case (SQASTReader *)0x41:
    local_8 = (FunctionDecl *)readGetSlotExpr(in_RDI);
    break;
  case (SQASTReader *)0x43:
    local_8 = (FunctionDecl *)readCallExpr((SQASTReader *)CONCAT44(op,in_stack_00000010));
    break;
  case (SQASTReader *)0x44:
    local_8 = (FunctionDecl *)readTernaryExpr(in_RDI);
    break;
  case (SQASTReader *)0x47:
    local_8 = (FunctionDecl *)
              readValueDecl((SQASTReader *)CONCAT44(op,in_stack_00000010),in_stack_0000000f);
    break;
  case (SQASTReader *)0x48:
    local_8 = (FunctionDecl *)
              readValueDecl((SQASTReader *)CONCAT44(op,in_stack_00000010),in_stack_0000000f);
    break;
  case (SQASTReader *)0x49:
    local_8 = (FunctionDecl *)readConstDecl(in_RDI);
    break;
  case (SQASTReader *)0x4a:
    local_8 = (FunctionDecl *)readDeclGroup(this_00);
    break;
  case (SQASTReader *)0x4b:
    local_8 = (FunctionDecl *)readDestructuringDecl(in_RDI);
    break;
  case (SQASTReader *)0x4c:
    local_8 = readFunctionDecl(in_stack_00000040,in_stack_0000003f);
    break;
  case (SQASTReader *)0x4d:
    local_8 = readFunctionDecl(in_stack_00000040,in_stack_0000003f);
    break;
  case (SQASTReader *)0x4e:
    local_8 = (FunctionDecl *)readClassDecl(in_RDI);
    break;
  case (SQASTReader *)0x4f:
    local_8 = (FunctionDecl *)readEnumDecl((SQASTReader *)CONCAT44(op,in_stack_00000010));
    break;
  case (SQASTReader *)0x50:
    local_8 = (FunctionDecl *)readTableDecl(this_00);
  }
  return (Node *)local_8;
}

Assistant:

Node *SQASTReader::readNode(enum TreeOp op) {
  switch (op)
  {
  case TO_BLOCK: return readBlock(false);
  case TO_IF: return readIfStatement();
  case TO_WHILE: return readWhileStatement();
  case TO_DOWHILE: return readDoWhileStatement();
  case TO_FOR: return readForStatement();
  case TO_FOREACH: return readForeachStatement();
  case TO_SWITCH: return readSwitchStatement();
  case TO_RETURN: return readReturnStatement();
  case TO_YIELD: return readYieldStatement();
  case TO_THROW: return readThrowStatement();
  case TO_TRY: return readTryStatement();
  case TO_BREAK: return readBreakStatement();
  case TO_CONTINUE: return readContinueStatement();
  case TO_EXPR_STMT: return readExprStatement();
  case TO_EMPTY: return readEmptyStatement();
  // case TO_STATEMENT_MARK:
  case TO_ID: return readId();
  case TO_COMMA: return readCommaExpr();
  case TO_NULLC:
  case TO_ASSIGN:
  case TO_OROR:
  case TO_ANDAND:
  case TO_OR:
  case TO_XOR:
  case TO_AND:
  case TO_NE:
  case TO_EQ:
  case TO_3CMP:
  case TO_GE:
  case TO_GT:
  case TO_LE:
  case TO_LT:
  case TO_IN:
  case TO_INSTANCEOF:
  case TO_USHR:
  case TO_SHR:
  case TO_SHL:
  case TO_MUL:
  case TO_DIV:
  case TO_MOD:
  case TO_ADD:
  case TO_SUB:
  case TO_NEWSLOT:
  case TO_PLUSEQ:
  case TO_MINUSEQ:
  case TO_MULEQ:
  case TO_DIVEQ:
  case TO_MODEQ:
    return readBinExpr(op);
  case TO_NOT:
  case TO_BNOT:
  case TO_NEG:
  case TO_TYPEOF:
  case TO_RESUME:
  case TO_CLONE:
  case TO_PAREN:
  case TO_DELETE:
    return readUnaryExpr(op);
  case TO_LITERAL: return readLiteral();
  case TO_BASE: return readBaseExpr();
  case TO_ROOT_TABLE_ACCESS: return readRootTableAccessExpr();
  case TO_INC: return readIncExpr();
  case TO_DECL_EXPR: return readDeclExpr();
  case TO_ARRAYEXPR: return readArrayExpr();
  case TO_GETFIELD: return readGetFieldExpr();
  case TO_GETSLOT: return readGetSlotExpr();
  case TO_CALL: return readCallExpr();
  case TO_TERNARY: return readTernaryExpr();
  // case TO_EXPR_MARK:
  case TO_VAR: return readValueDecl(true);
  case TO_PARAM: return readValueDecl(false);
  case TO_CONST: return readConstDecl();
  case TO_DECL_GROUP: return readDeclGroup();
  case TO_DESTRUCTURE: return readDestructuringDecl();
  case TO_FUNCTION: return readFunctionDecl(false);
  case TO_CONSTRUCTOR: return readFunctionDecl(true);
  case TO_CLASS: return readClassDecl();
  case TO_ENUM: return readEnumDecl();
  case TO_TABLE: return readTableDecl();
  case TO_DIRECTIVE: return readDirectiveStmt();
  default:
    assert("Unknown Tree code");
    return NULL;
  }
}